

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  undefined1 *puVar1;
  char *pcVar2;
  CURLUcode CVar3;
  int iVar4;
  CURLU *u;
  long lVar5;
  long lVar6;
  size_t sVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  CURLcode CVar10;
  proxy_info *ppVar11;
  curl_proxytype cVar12;
  char *scheme;
  char *host;
  char *proxypasswd;
  char *proxyuser;
  char *portptr;
  char *local_70;
  connectdata *local_68;
  char *local_60;
  char *local_58;
  undefined4 local_50;
  curl_proxytype local_4c;
  char *local_48;
  proxy_info *local_40;
  char *local_38;
  
  local_48 = (char *)0x0;
  local_58 = (char *)0x0;
  u = curl_url();
  local_70 = (char *)0x0;
  CVar3 = curl_url_set(u,CURLUPART_URL,proxy,0x208);
  if (CVar3 != CURLUE_OK) {
    Curl_failf(data,"Unsupported proxy syntax in \'%s\'",proxy);
    CVar10 = CURLE_COULDNT_RESOLVE_PROXY;
    goto LAB_00125d25;
  }
  uVar9 = 0;
  local_68 = conn;
  CVar3 = curl_url_get(u,CURLUPART_SCHEME,&local_70,0);
  CVar10 = CURLE_OUT_OF_MEMORY;
  if (CVar3 != CURLUE_OK) goto LAB_00125d25;
  iVar4 = Curl_strcasecompare("https",local_70);
  cVar12 = CURLPROXY_HTTPS;
  if (iVar4 == 0) {
    iVar4 = Curl_strcasecompare("socks5h",local_70);
    if (iVar4 == 0) {
      iVar4 = Curl_strcasecompare("socks5",local_70);
      if (iVar4 == 0) {
        iVar4 = Curl_strcasecompare("socks4a",local_70);
        if (iVar4 == 0) {
          iVar4 = Curl_strcasecompare("socks4",local_70);
          cVar12 = CURLPROXY_SOCKS4;
          if (iVar4 == 0) {
            iVar4 = Curl_strcasecompare("socks",local_70);
            if (iVar4 == 0) {
              iVar4 = Curl_strcasecompare("http",local_70);
              cVar12 = proxytype;
              if (iVar4 == 0) {
                Curl_failf(data,"Unsupported proxy scheme for \'%s\'",proxy);
                CVar10 = CURLE_COULDNT_CONNECT;
                goto LAB_00125d25;
              }
              goto LAB_00125d67;
            }
          }
        }
        else {
          cVar12 = CURLPROXY_SOCKS4A;
        }
      }
      else {
        cVar12 = CURLPROXY_SOCKS5;
      }
    }
    else {
      cVar12 = CURLPROXY_SOCKS5_HOSTNAME;
    }
    uVar8 = 0;
  }
  else {
LAB_00125d67:
    uVar8 = (undefined4)CONCAT71((int7)((ulong)uVar9 >> 8),cVar12 == CURLPROXY_HTTPS);
    if ((cVar12 == CURLPROXY_HTTPS) && ((Curl_ssl->supports & 0x10) == 0)) {
      Curl_failf(data,"Unsupported proxy \'%s\', libcurl is built without the HTTPS-proxy support.",
                 proxy);
      CVar10 = CURLE_NOT_BUILT_IN;
      goto LAB_00125d25;
    }
  }
  local_50 = uVar8;
  local_4c = cVar12 & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
  local_40 = &local_68->socks_proxy;
  ppVar11 = &local_68->http_proxy;
  if (local_4c == CURLPROXY_SOCKS4) {
    ppVar11 = local_40;
  }
  ppVar11->proxytype = cVar12;
  curl_url_get(u,CURLUPART_USER,&local_48,0x40);
  curl_url_get(u,CURLUPART_PASSWORD,&local_58,0x40);
  if (local_58 != (char *)0x0 || local_48 != (char *)0x0) {
    (*Curl_cfree)(ppVar11->user);
    ppVar11->user = local_48;
    (*Curl_cfree)(ppVar11->passwd);
    ppVar11->passwd = (char *)0x0;
    if (local_58 == (char *)0x0) {
      local_58 = (*Curl_cstrdup)("");
      if (local_58 == (char *)0x0) goto LAB_00125d25;
    }
    ppVar11->passwd = local_58;
    puVar1 = &(local_68->bits).field_0x5;
    *puVar1 = *puVar1 | 1;
  }
  curl_url_get(u,CURLUPART_PORT,&local_38,0);
  if (local_38 == (char *)0x0) {
    lVar5 = (data->set).proxyport;
    lVar6 = 0x438;
    if ((char)local_50 != '\0') {
      lVar6 = 0x1bb;
    }
    if (lVar5 != 0) goto LAB_00125f6b;
LAB_00125f73:
    ppVar11->port = lVar6;
    if (((local_4c == CURLPROXY_SOCKS4) || (local_68->port < 0)) ||
       ((local_40->host).rawalloc == (char *)0x0)) {
      local_68->port = lVar6;
    }
  }
  else {
    lVar5 = strtol(local_38,(char **)0x0,10);
    (*Curl_cfree)(local_38);
LAB_00125f6b:
    lVar6 = lVar5;
    if (-1 < lVar6) goto LAB_00125f73;
  }
  CVar3 = curl_url_get(u,CURLUPART_HOST,&local_60,0x40);
  if (CVar3 == CURLUE_OK) {
    (*Curl_cfree)((ppVar11->host).rawalloc);
    pcVar2 = local_60;
    (ppVar11->host).rawalloc = local_60;
    if (*local_60 == '[') {
      sVar7 = strlen(local_60);
      pcVar2[sVar7 - 1] = '\0';
      local_60 = local_60 + 1;
    }
    (ppVar11->host).name = local_60;
    CVar10 = CURLE_OK;
  }
LAB_00125d25:
  (*Curl_cfree)(local_70);
  curl_url_cleanup(u);
  return CVar10;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *portptr;
  long port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  char *host;
  bool sockstype;
  CURLUcode uc;
  struct proxy_info *proxyinfo;
  CURLU *uhp = curl_url();
  CURLcode result = CURLE_OK;
  char *scheme = NULL;

  /* When parsing the proxy, allowing non-supported schemes since we have
     these made up ones for proxies. Guess scheme for URLs without it. */
  uc = curl_url_set(uhp, CURLUPART_URL, proxy,
                    CURLU_NON_SUPPORT_SCHEME|CURLU_GUESS_SCHEME);
  if(!uc) {
    /* parsed okay as a URL */
    uc = curl_url_get(uhp, CURLUPART_SCHEME, &scheme, 0);
    if(uc) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    if(strcasecompare("https", scheme))
      proxytype = CURLPROXY_HTTPS;
    else if(strcasecompare("socks5h", scheme))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(strcasecompare("socks5", scheme))
      proxytype = CURLPROXY_SOCKS5;
    else if(strcasecompare("socks4a", scheme))
      proxytype = CURLPROXY_SOCKS4A;
    else if(strcasecompare("socks4", scheme) ||
            strcasecompare("socks", scheme))
      proxytype = CURLPROXY_SOCKS4;
    else if(strcasecompare("http", scheme))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      result = CURLE_COULDNT_CONNECT;
      goto error;
    }
  }
  else {
    failf(data, "Unsupported proxy syntax in \'%s\'", proxy);
    result = CURLE_COULDNT_RESOLVE_PROXY;
    goto error;
  }

#ifdef USE_SSL
  if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
#endif
    if(proxytype == CURLPROXY_HTTPS) {
      failf(data, "Unsupported proxy \'%s\', libcurl is built without the "
                  "HTTPS-proxy support.", proxy);
      result = CURLE_NOT_BUILT_IN;
      goto error;
    }

  sockstype =
    proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
    proxytype == CURLPROXY_SOCKS5 ||
    proxytype == CURLPROXY_SOCKS4A ||
    proxytype == CURLPROXY_SOCKS4;

  proxyinfo = sockstype ? &conn->socks_proxy : &conn->http_proxy;
  proxyinfo->proxytype = proxytype;

  /* Is there a username and password given in this proxy url? */
  curl_url_get(uhp, CURLUPART_USER, &proxyuser, CURLU_URLDECODE);
  curl_url_get(uhp, CURLUPART_PASSWORD, &proxypasswd, CURLU_URLDECODE);
  if(proxyuser || proxypasswd) {
    Curl_safefree(proxyinfo->user);
    proxyinfo->user = proxyuser;
    Curl_safefree(proxyinfo->passwd);
    if(!proxypasswd) {
      proxypasswd = strdup("");
      if(!proxypasswd) {
        result = CURLE_OUT_OF_MEMORY;
        goto error;
      }
    }
    proxyinfo->passwd = proxypasswd;
    conn->bits.proxy_user_passwd = TRUE; /* enable it */
  }

  curl_url_get(uhp, CURLUPART_PORT, &portptr, 0);

  if(portptr) {
    port = strtol(portptr, NULL, 10);
    free(portptr);
  }
  else {
    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }
  if(port >= 0) {
    proxyinfo->port = port;
    if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
      conn->port = port;
  }

  /* now, clone the proxy host name */
  uc = curl_url_get(uhp, CURLUPART_HOST, &host, CURLU_URLDECODE);
  if(uc) {
    result = CURLE_OUT_OF_MEMORY;
    goto error;
  }
  Curl_safefree(proxyinfo->host.rawalloc);
  proxyinfo->host.rawalloc = host;
  if(host[0] == '[') {
    /* this is a numerical IPv6, strip off the brackets */
    size_t len = strlen(host);
    host[len-1] = 0; /* clear the trailing bracket */
    host++;
  }
  proxyinfo->host.name = host;

  error:
  free(scheme);
  curl_url_cleanup(uhp);
  return result;
}